

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fdivr_STN_ST0_x86_64(CPUX86State *env,int st_index)

{
  FPReg *pFVar1;
  floatx80 fVar2;
  floatx80 b;
  undefined6 uStack_26;
  floatx80 *p;
  int st_index_local;
  CPUX86State *env_local;
  
  pFVar1 = env->fpregs + (env->fpstt + st_index & 7);
  fVar2._10_6_ = 0;
  fVar2._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  b._10_6_ = 0;
  b._0_10_ = *(unkuint10 *)pFVar1;
  fVar2 = helper_fdiv(env,fVar2,b);
  (pFVar1->d).low = fVar2.low;
  *(ulong *)((long)pFVar1 + 8) = CONCAT62(uStack_26,fVar2.high);
  return;
}

Assistant:

void helper_fdivr_STN_ST0(CPUX86State *env, int st_index)
{
    floatx80 *p;

    p = &ST(st_index);
    *p = helper_fdiv(env, ST0, *p);
}